

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O1

base_learner * active_cover_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  vw *all_00;
  int iVar2;
  active_cover *dat;
  option_group_definition *poVar3;
  typed_option<float> *ptVar4;
  _func_int ***__dest;
  typed_option<unsigned_long> *op;
  base_learner *l;
  single_learner *base;
  float *pfVar5;
  ulong uVar6;
  learner<active_cover,_example> *plVar7;
  vw_exception *pvVar8;
  ulong uVar9;
  bool active_cover_option;
  size_type __dnew_6;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_5;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_711;
  options_i *local_710;
  size_t *local_708;
  _func_int ***local_700;
  _func_int **local_6f8;
  _func_int **local_6f0 [2];
  vw *local_6e0;
  long local_6d8;
  _func_int ***local_6d0;
  _func_int **local_6c8;
  _func_int **local_6c0 [2];
  _func_int ***local_6b0;
  _func_int **local_6a8;
  _func_int **local_6a0 [2];
  _func_int ***local_690;
  _func_int **local_688;
  _func_int **local_680 [2];
  _func_int ***local_670;
  _func_int **local_668;
  _func_int **local_660 [2];
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  option_group_definition local_5b0;
  long *local_578;
  long local_570;
  long local_568 [2];
  _func_int ***local_558;
  _func_int **local_550;
  _func_int **local_548 [2];
  string local_538;
  string local_518;
  string local_4f8;
  undefined1 local_4d8 [20];
  undefined2 local_4c4;
  undefined1 local_4c2;
  string local_4a8 [64];
  bool local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  local_710 = options;
  dat = calloc_or_throw<active_cover>(1);
  dat->active_c0 = 0.0;
  dat->alpha = 0.0;
  dat->beta_scale = 0.0;
  dat->oracular = false;
  *(undefined3 *)&dat->field_0xd = 0;
  dat->cover_size = 0;
  dat->lambda_n = (float *)0x0;
  dat->lambda_d = (float *)0x0;
  dat->all = (vw *)0x0;
  dat->l = (base_learner *)0x0;
  local_4d8._0_8_ = (_func_int **)0x1a;
  local_700 = local_6f0;
  local_700 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_700,(ulong)local_4d8);
  local_6f0[0] = (_func_int **)local_4d8._0_8_;
  builtin_strncpy((char *)((long)local_700 + 10),"rning wi",8);
  builtin_strncpy((char *)((long)local_700 + 0x12),"th Cover",8);
  *(undefined4 *)local_700 = 0x69746341;
  builtin_strncpy((char *)((long)local_700 + 4),"ve L",4);
  *(undefined4 *)(local_700 + 1) = 0x6e726165;
  builtin_strncpy((char *)((long)local_700 + 0xc),"ing ",4);
  local_6f8 = (_func_int **)local_4d8._0_8_;
  *(char *)((long)local_700 + local_4d8._0_8_) = '\0';
  local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5b0,local_700,(char *)(local_4d8._0_8_ + (long)local_700));
  local_5b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_700 != local_6f0) {
    operator_delete(local_700);
  }
  local_711 = false;
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  local_5d0.field_2._M_allocated_capacity = 0x635f657669746361;
  local_5d0.field_2._8_4_ = 0x7265766f;
  local_5d0._M_string_length = 0xc;
  local_5d0.field_2._M_local_buf[0xc] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4d8,&local_5d0,&local_711);
  local_468 = true;
  local_670 = local_660;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x21;
  local_670 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_670,(ulong)&local_d0);
  local_660[0] = local_d0.super_base_option._vptr_base_option;
  local_670[2] = (_func_int **)0x7720676e696e7261;
  local_670[3] = (_func_int **)0x65766f6320687469;
  *local_670 = (_func_int **)0x6120656c62616e65;
  local_670[1] = (_func_int **)0x656c206576697463;
  *(char *)(local_670 + 4) = 'r';
  local_668 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_670 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign(local_4a8);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_5b0,(typed_option<bool> *)local_4d8);
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  local_5f0.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_5f0.field_2._8_2_ = 0x7373;
  local_5f0._M_string_length = 10;
  local_5f0.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_d0,&local_5f0,&dat->active_c0);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_d0,8.0);
  local_690 = local_680;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x34;
  local_690 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_690,(ulong)&local_170);
  local_680[0] = local_170.super_base_option._vptr_base_option;
  local_690[4] = (_func_int **)0x305f632072657465;
  local_690[5] = (_func_int **)0x6c7561666544202e;
  local_690[2] = (_func_int **)0x656e776f6c6c656d;
  local_690[3] = (_func_int **)0x6d61726170207373;
  *local_690 = (_func_int **)0x6c20657669746361;
  local_690[1] = (_func_int **)0x20676e696e726165;
  *(undefined4 *)(local_690 + 6) = 0x2e382074;
  local_688 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_690 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  local_610.field_2._M_allocated_capacity._0_4_ = 0x68706c61;
  local_610.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_610._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_170,&local_610,&dat->alpha);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_170,1.0);
  local_6b0 = local_6a0;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x40;
  local_6b0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6b0,(ulong)&local_210);
  local_6a0[0] = local_210.super_base_option._vptr_base_option;
  local_6b0[6] = (_func_int **)0x6544202e6168706c;
  local_6b0[7] = (_func_int **)0x2e3120746c756166;
  local_6b0[4] = (_func_int **)0x72617020646e756f;
  local_6b0[5] = (_func_int **)0x6120726574656d61;
  local_6b0[2] = (_func_int **)0x65636e6169726176;
  local_6b0[3] = (_func_int **)0x6220726570707520;
  *local_6b0 = (_func_int **)0x6c20657669746361;
  local_6b0[1] = (_func_int **)0x20676e696e726165;
  local_6a8 = local_210.super_base_option._vptr_base_option;
  *(char *)((long)local_6b0 + (long)local_210.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  local_630.field_2._M_allocated_capacity = 0x6163735f61746562;
  local_630.field_2._8_2_ = 0x656c;
  local_630._M_string_length = 10;
  local_630.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_210,&local_630,&dat->beta_scale);
  ptVar4 = VW::config::typed_option<float>::default_value(&local_210,3.1622777);
  local_6d0 = local_6c0;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x4c;
  local_6e0 = all;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6d0,(ulong)&local_2b0);
  pp_Var1 = local_2b0.super_base_option._vptr_base_option;
  local_6c0[0] = local_2b0.super_base_option._vptr_base_option;
  local_6d0 = __dest;
  memcpy(__dest,"active learning variance upper bound parameter beta_scale. Default sqrt(10).",0x4c)
  ;
  local_6c8 = pp_Var1;
  *(undefined1 *)((long)__dest + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  local_650.field_2._M_allocated_capacity._0_4_ = 0x65766f63;
  local_650.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_650._M_string_length = 5;
  local_708 = &dat->cover_size;
  VW::config::typed_option<unsigned_long>::typed_option(&local_2b0,&local_650,local_708);
  local_2b0.super_base_option.m_keep = true;
  op = VW::config::typed_option<unsigned_long>::default_value(&local_2b0,0xc);
  all_00 = local_6e0;
  local_350._0_8_ = (_func_int **)0x17;
  local_558 = local_548;
  local_558 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_558,(ulong)local_350);
  local_548[0] = (_func_int **)local_350._0_8_;
  *local_558 = (_func_int **)0x6973207265766f63;
  local_558[1] = (_func_int **)0x61666544202e657a;
  builtin_strncpy((char *)((long)local_558 + 0xf),"ault 12.",8);
  local_550 = (_func_int **)local_350._0_8_;
  *(char *)((long)local_558 + local_350._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,op);
  local_538.field_2._M_allocated_capacity = 0x72616c756361726f;
  local_538._M_string_length = 8;
  local_538.field_2._M_local_buf[8] = '\0';
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_538,&dat->oracular);
  local_6d8 = 0x33;
  local_578 = local_568;
  local_578 = (long *)std::__cxx11::string::_M_create((ulong *)&local_578,(ulong)&local_6d8);
  local_568[0] = local_6d8;
  local_578[4] = 0x666544202e746f6e;
  local_578[5] = 0x6c616620746c7561;
  local_578[2] = 0x7120656c79747320;
  local_578[3] = 0x20726f2079726575;
  *local_578 = 0x6361724f20657355;
  local_578[1] = 0x4c41432d72616c75;
  builtin_strncpy((char *)((long)local_578 + 0x2f),"lse.",4);
  local_570 = local_6d8;
  *(char *)((long)local_578 + local_6d8) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_350);
  if (local_578 != local_568) {
    operator_delete(local_578);
  }
  local_350._0_8_ = &PTR__typed_option_002e8e48;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p);
  }
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002e8f20;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p);
  }
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002e8f58;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p);
  }
  if (local_6b0 != local_6a0) {
    operator_delete(local_6b0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002e8f58;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p);
  }
  if (local_690 != local_680) {
    operator_delete(local_690);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002e8f58;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p);
  }
  if (local_670 != local_660) {
    operator_delete(local_670);
  }
  local_4d8._0_8_ = &PTR__typed_option_002e8e48;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p);
  }
  (**local_710->_vptr_options_i)(local_710,&local_5b0);
  if (local_711 == false) {
    plVar7 = (learner<active_cover,_example> *)0x0;
  }
  else {
    dat->all = all_00;
    dat->beta_scale = dat->beta_scale * dat->beta_scale;
    if (dat->oracular == true) {
      *local_708 = 0;
    }
    pp_Var1 = (_func_int **)(local_4d8 + 0x10);
    local_4d8._16_4_ = 0x61646c;
    local_4d8._8_8_ = (pointer)0x3;
    local_4d8._0_8_ = pp_Var1;
    iVar2 = (*local_710->_vptr_options_i[1])(local_710,local_4d8);
    if ((_func_int **)local_4d8._0_8_ != pp_Var1) {
      operator_delete((void *)local_4d8._0_8_);
    }
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_4d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_4d8 + 0x10),"error: you can\'t combine lda and active learning",
                 0x30);
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x101,&local_4f8);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_4d8._16_4_ = 0x69746361;
    local_4c4 = 0x6576;
    local_4d8._8_8_ = (pointer)0x6;
    local_4c2 = 0;
    local_4d8._0_8_ = pp_Var1;
    iVar2 = (*local_710->_vptr_options_i[1])();
    if ((_func_int **)local_4d8._0_8_ != pp_Var1) {
      operator_delete((void *)local_4d8._0_8_);
    }
    if ((char)iVar2 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_4d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_4d8 + 0x10),
                 "error: you can\'t use --active_cover and --active at the same time",0x41);
      pvVar8 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/active_cover.cc"
                 ,0x104,&local_518);
      __cxa_throw(pvVar8,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    l = setup_base(local_710,all_00);
    base = LEARNER::as_singleline<char,char>(l);
    pfVar5 = (float *)operator_new__(-(ulong)(*local_708 >> 0x3e != 0) | *local_708 << 2);
    dat->lambda_n = pfVar5;
    uVar9 = 0xffffffffffffffff;
    if (dat->cover_size < 0x4000000000000000) {
      uVar9 = dat->cover_size * 4;
    }
    pfVar5 = (float *)operator_new__(uVar9);
    dat->lambda_d = pfVar5;
    uVar9 = dat->cover_size;
    if (uVar9 != 0) {
      uVar6 = 0;
      do {
        dat->lambda_n[uVar6] = 0.0;
        dat->lambda_d[uVar6] = 0.125;
        uVar6 = uVar6 + 1;
        uVar9 = dat->cover_size;
      } while (uVar6 < uVar9);
    }
    plVar7 = LEARNER::learner<active_cover,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn_active_cover<true>,
                        predict_or_learn_active_cover<false>,uVar9 + 1,
                        *(prediction_type_t *)(base + 0xd0));
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish;
    dat = (active_cover *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5b0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p);
  }
  if (dat != (active_cover *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* active_cover_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<active_cover>();
  option_group_definition new_options("Active Learning with Cover");

  bool active_cover_option = false;
  new_options.add(make_option("active_cover", active_cover_option).keep().help("enable active learning with cover"))
      .add(make_option("mellowness", data->active_c0)
               .default_value(8.f)
               .help("active learning mellowness parameter c_0. Default 8."))
      .add(make_option("alpha", data->alpha)
               .default_value(1.f)
               .help("active learning variance upper bound parameter alpha. Default 1."))
      .add(make_option("beta_scale", data->beta_scale)
               .default_value(sqrtf(10.f))
               .help("active learning variance upper bound parameter beta_scale. Default sqrt(10)."))
      .add(make_option("cover", data->cover_size).keep().default_value(12).help("cover size. Default 12."))
      .add(make_option("oracular", data->oracular).help("Use Oracular-CAL style query or not. Default false."));
  options.add_and_parse(new_options);

  if (!active_cover_option)
    return nullptr;

  data->all = &all;
  data->beta_scale *= data->beta_scale;

  if (data->oracular)
    data->cover_size = 0;

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --active_cover and --active at the same time");

  auto base = as_singleline(setup_base(options, all));

  data->lambda_n = new float[data->cover_size];
  data->lambda_d = new float[data->cover_size];

  for (size_t i = 0; i < data->cover_size; i++)
  {
    data->lambda_n[i] = 0.f;
    data->lambda_d[i] = 1.f / 8.f;
  }

  // Create new learner
  learner<active_cover, example>& l = init_learner(
      data, base, predict_or_learn_active_cover<true>, predict_or_learn_active_cover<false>, data->cover_size + 1);
  l.set_finish(finish);

  return make_base(l);
}